

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O2

int LZWDecodeCompat(TIFF *tif,uint8_t *op0,tmsize_t occ0,uint16_t s)

{
  byte *pbVar1;
  uint8_t *puVar2;
  long *plVar3;
  uint8_t *puVar4;
  long lVar5;
  long *plVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  char *fmt;
  uint8_t *puVar14;
  char *module;
  ulong uVar15;
  long *plVar16;
  int iVar17;
  tmsize_t tVar18;
  byte *pbVar19;
  long *plVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uStack_70;
  uint8_t *local_50;
  
  puVar2 = tif->tif_data;
  if (puVar2 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                  ,0x32f,"int LZWDecodeCompat(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar12 = *(long *)(puVar2 + 0xa8);
  uVar11 = occ0;
  if (lVar12 != 0) {
    plVar20 = *(long **)(puVar2 + 200);
    lVar5 = (ulong)*(ushort *)(plVar20 + 1) - lVar12;
    uVar11 = occ0 - lVar5;
    if (occ0 < lVar5) {
      *(long *)(puVar2 + 0xa8) = lVar12 + occ0;
      lVar12 = lVar5;
      do {
        plVar20 = (long *)*plVar20;
        lVar12 = lVar12 + -1;
      } while (occ0 < lVar12);
      uVar11 = 0;
      tVar18 = occ0;
      do {
        op0[tVar18 + -1] = *(uint8_t *)((long)plVar20 + 0xb);
        plVar20 = (long *)*plVar20;
        tVar18 = tVar18 + -1;
      } while (tVar18 != 0);
    }
    else {
      lVar12 = lVar5;
      do {
        op0[lVar12 + -1] = *(uint8_t *)((long)plVar20 + 0xb);
        plVar20 = (long *)*plVar20;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      puVar2[0xa8] = '\0';
      puVar2[0xa9] = '\0';
      puVar2[0xaa] = '\0';
      puVar2[0xab] = '\0';
      puVar2[0xac] = '\0';
      puVar2[0xad] = '\0';
      puVar2[0xae] = '\0';
      puVar2[0xaf] = '\0';
      op0 = op0 + lVar5;
    }
    if (occ0 < lVar5) {
      return 1;
    }
  }
  pbVar19 = tif->tif_rawcp;
  uVar21 = (tif->tif_rawcc - *(long *)(puVar2 + 0xb8)) * 8 + *(long *)(puVar2 + 0xb0);
  *(ulong *)(puVar2 + 0xb0) = uVar21;
  uStack_70 = (ulong)*(ushort *)(puVar2 + 0x80);
  uVar22 = *(ulong *)(puVar2 + 0x88);
  lVar12 = *(long *)(puVar2 + 0x90);
  uVar15 = *(ulong *)(puVar2 + 0xa0);
  plVar20 = *(long **)(puVar2 + 0xd8);
  plVar16 = *(long **)(puVar2 + 0xe0);
  plVar10 = *(long **)(puVar2 + 0xd0);
  puVar4 = op0;
LAB_0026594d:
  do {
    local_50 = puVar4;
    uVar8 = uVar21;
    if ((long)uVar11 < 1) goto LAB_00265c6f;
    iVar17 = (int)uStack_70;
    uVar8 = uVar21 - uStack_70;
    if (uVar21 < uStack_70) {
      TIFFWarningExtR(tif,"LZWDecodeCompat","LZWDecode: Strip %u not terminated with EOI code",
                      (ulong)tif->tif_curstrip);
      uVar8 = uVar21;
      goto LAB_00265c6f;
    }
    uVar13 = (ulong)*pbVar19 << ((byte)lVar12 & 0x3f) | uVar22;
    lVar5 = lVar12 + 8;
    if (lVar5 < (long)uStack_70) {
      pbVar1 = pbVar19 + 1;
      pbVar19 = pbVar19 + 2;
      uVar13 = uVar13 | (ulong)*pbVar1 << ((byte)lVar5 & 0x3f);
      lVar5 = lVar12 + 0x10;
    }
    else {
      pbVar19 = pbVar19 + 1;
    }
    uVar22 = uVar13 >> ((byte)uStack_70 & 0x3f);
    uVar13 = uVar13 & uVar15;
    lVar12 = lVar5 - uStack_70;
    if ((short)uVar13 != 0x100) {
      if (((uint)uVar13 & 0xffff) == 0x101) goto LAB_00265c6f;
      plVar3 = *(long **)(puVar2 + 0xe8);
      if ((((plVar20 < plVar3) || (plVar3 + 0x27fe <= plVar20)) ||
          (*plVar20 = (long)plVar10, plVar10 < plVar3)) || (plVar3 + 0x27fe <= plVar10)) {
        uVar11 = (ulong)tif->tif_row;
        module = "LZWDecodeCompat";
        fmt = "Corrupted LZW table at scanline %u";
      }
      else {
        plVar6 = (long *)((ulong)(((uint)uVar13 & 0xffff) << 4) + (long)plVar3);
        *(undefined1 *)((long)plVar20 + 10) = *(undefined1 *)((long)plVar10 + 10);
        *(short *)(plVar20 + 1) = (short)(int)plVar10[1] + 1;
        plVar10 = plVar20;
        if (plVar6 < plVar20) {
          plVar10 = plVar6;
        }
        *(undefined1 *)((long)plVar20 + 0xb) = *(undefined1 *)((long)plVar10 + 10);
        plVar20 = plVar20 + 2;
        if (plVar16 < plVar20) {
          if (10 < iVar17) {
            iVar17 = 0xb;
          }
          uStack_70 = (ulong)(iVar17 + 1U);
          uVar15 = ~(-1L << ((byte)(iVar17 + 1U) & 0x3f));
          plVar16 = plVar3 + uVar15 * 2;
        }
        plVar10 = plVar6;
        uVar21 = uVar8;
        if ((uVar13 & 0xff00) == 0) {
          *local_50 = (uint8_t)uVar13;
          uVar11 = uVar11 - 1;
          puVar4 = local_50 + 1;
          goto LAB_0026594d;
        }
        uVar13 = (ulong)*(ushort *)(plVar6 + 1);
        if (uVar13 != 0) {
          uVar9 = uVar11 - uVar13;
          if (uVar13 <= uVar11) {
            puVar14 = local_50 + uVar13;
            do {
              puVar14 = puVar14 + -1;
              *puVar14 = *(uint8_t *)((long)plVar6 + 0xb);
              plVar6 = (long *)*plVar6;
              uVar11 = uVar9;
              puVar4 = local_50 + uVar13;
              if (plVar6 == (long *)0x0) break;
            } while (local_50 < puVar14);
            goto LAB_0026594d;
          }
          *(long **)(puVar2 + 200) = plVar6;
          do {
            plVar6 = (long *)*plVar6;
          } while ((ushort)uVar11 < *(ushort *)(plVar6 + 1));
          *(ulong *)(puVar2 + 0xa8) = uVar11;
          do {
            local_50[uVar11 - 1] = *(uint8_t *)((long)plVar6 + 0xb);
            plVar6 = (long *)*plVar6;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
          uVar11 = 0;
LAB_00265c6f:
          puVar4 = tif->tif_rawcp;
          lVar5 = tif->tif_rawcc;
          tif->tif_rawcc = (tmsize_t)(puVar4 + (lVar5 - (long)pbVar19));
          tif->tif_rawcp = pbVar19;
          *(uint8_t **)(puVar2 + 0xb8) = puVar4 + (lVar5 - (long)pbVar19);
          *(ulong *)(puVar2 + 0xb0) = uVar8;
          *(short *)(puVar2 + 0x80) = (short)uStack_70;
          *(ulong *)(puVar2 + 0x88) = uVar22;
          *(long *)(puVar2 + 0x90) = lVar12;
          *(ulong *)(puVar2 + 0xa0) = uVar15;
          *(long **)(puVar2 + 0xd0) = plVar10;
          *(long **)(puVar2 + 0xd8) = plVar20;
          *(long **)(puVar2 + 0xe0) = plVar16;
          if ((long)uVar11 < 1) {
            return 1;
          }
          TIFFErrorExtR(tif,"LZWDecodeCompat","Not enough data at scanline %u (short %lu bytes)",
                        (ulong)tif->tif_row,uVar11);
          return 0;
        }
        uVar11 = (ulong)tif->tif_row;
        module = "LZWDecodeCompat";
        fmt = "Wrong length of decoded string: data probably corrupted at scanline %u";
      }
LAB_00265de7:
      TIFFErrorExtR(tif,module,fmt,uVar11);
      return 0;
    }
    do {
      plVar20 = (long *)(*(long *)(puVar2 + 0xe8) + 0x1020);
      _TIFFmemset(plVar20,0,0x12fd0);
      uVar21 = uVar8 - 9;
      if (uVar8 < 9) {
        lVar5 = *(long *)(puVar2 + 0xe8);
        TIFFWarningExtR(tif,"LZWDecodeCompat","LZWDecode: Strip %u not terminated with EOI code",
                        (ulong)tif->tif_curstrip);
        goto LAB_00265c62;
      }
      uVar13 = (ulong)*pbVar19 << ((byte)lVar12 & 0x3f) | uVar22;
      lVar5 = lVar12 + 8;
      if (lVar12 < 1) {
        pbVar1 = pbVar19 + 1;
        pbVar19 = pbVar19 + 2;
        uVar13 = uVar13 | (ulong)*pbVar1 << ((byte)lVar5 & 0x3f);
        lVar5 = lVar12 + 0x10;
      }
      else {
        pbVar19 = pbVar19 + 1;
      }
      uVar7 = (uint)uVar13 & 0x1ff;
      uVar22 = uVar13 >> 9;
      lVar12 = lVar5 + -9;
      uVar8 = uVar21;
    } while (uVar7 == 0x100);
    if (uVar7 == 0x101) {
      lVar5 = *(long *)(puVar2 + 0xe8);
LAB_00265c62:
      plVar16 = (long *)(lVar5 + 0x1ff0);
      uStack_70 = 9;
      uVar15 = 0x1ff;
      goto LAB_00265c6f;
    }
    if (0x100 < uVar7) {
      module = tif->tif_name;
      uVar11 = (ulong)tif->tif_row;
      fmt = "LZWDecode: Corrupted LZW table at scanline %u";
      goto LAB_00265de7;
    }
    plVar16 = (long *)(*(long *)(puVar2 + 0xe8) + 0x1ff0);
    *local_50 = (uint8_t)uVar13;
    uVar15 = 0x1ff;
    uStack_70 = 9;
    plVar10 = (long *)((ulong)(((uint)uVar13 & 0x1ff) << 4) + *(long *)(puVar2 + 0xe8));
    uVar11 = uVar11 - 1;
    puVar4 = local_50 + 1;
  } while( true );
}

Assistant:

static int LZWDecodeCompat(TIFF *tif, uint8_t *op0, tmsize_t occ0, uint16_t s)
{
    static const char module[] = "LZWDecodeCompat";
    LZWCodecState *sp = DecoderState(tif);
    uint8_t *op = (uint8_t *)op0;
    tmsize_t occ = occ0;
    uint8_t *tp;
    uint8_t *bp;
    int code, nbits;
    int len;
    long nextbits, nbitsmask;
    WordType nextdata;
    code_t *codep, *free_entp, *maxcodep, *oldcodep;

    (void)s;
    assert(sp != NULL);

    /*
     * Restart interrupted output operation.
     */
    if (sp->dec_restart)
    {
        tmsize_t residue;

        codep = sp->dec_codep;
        residue = codep->length - sp->dec_restart;
        if (residue > occ)
        {
            /*
             * Residue from previous decode is sufficient
             * to satisfy decode request.  Skip to the
             * start of the decoded string, place decoded
             * values in the output buffer, and return.
             */
            sp->dec_restart += occ;
            do
            {
                codep = codep->next;
            } while (--residue > occ);
            tp = op + occ;
            do
            {
                *--tp = codep->value;
                codep = codep->next;
            } while (--occ);
            return (1);
        }
        /*
         * Residue satisfies only part of the decode request.
         */
        op += residue;
        occ -= residue;
        tp = op;
        do
        {
            *--tp = codep->value;
            codep = codep->next;
        } while (--residue);
        sp->dec_restart = 0;
    }

    bp = (uint8_t *)tif->tif_rawcp;

    sp->dec_bitsleft += (((uint64_t)tif->tif_rawcc - sp->old_tif_rawcc) << 3);
    uint64_t dec_bitsleft = sp->dec_bitsleft;

    nbits = sp->lzw_nbits;
    nextdata = sp->lzw_nextdata;
    nextbits = sp->lzw_nextbits;
    nbitsmask = sp->dec_nbitsmask;
    oldcodep = sp->dec_oldcodep;
    free_entp = sp->dec_free_entp;
    maxcodep = sp->dec_maxcodep;

    while (occ > 0)
    {
        NextCode(tif, sp, bp, code, GetNextCodeCompat, dec_bitsleft);
        if (code == CODE_EOI)
            break;
        if (code == CODE_CLEAR)
        {
            do
            {
                free_entp = sp->dec_codetab + CODE_FIRST;
                _TIFFmemset(free_entp, 0,
                            (CSIZE - CODE_FIRST) * sizeof(code_t));
                nbits = BITS_MIN;
                nbitsmask = MAXCODE(BITS_MIN);
                maxcodep = sp->dec_codetab + nbitsmask;
                NextCode(tif, sp, bp, code, GetNextCodeCompat, dec_bitsleft);
            } while (code == CODE_CLEAR); /* consecutive CODE_CLEAR codes */
            if (code == CODE_EOI)
                break;
            if (code > CODE_CLEAR)
            {
                TIFFErrorExtR(
                    tif, tif->tif_name,
                    "LZWDecode: Corrupted LZW table at scanline %" PRIu32,
                    tif->tif_row);
                return (0);
            }
            *op++ = (uint8_t)code;
            occ--;
            oldcodep = sp->dec_codetab + code;
            continue;
        }
        codep = sp->dec_codetab + code;

        /*
         * Add the new entry to the code table.
         */
        if (free_entp < &sp->dec_codetab[0] ||
            free_entp >= &sp->dec_codetab[CSIZE])
        {
            TIFFErrorExtR(tif, module,
                          "Corrupted LZW table at scanline %" PRIu32,
                          tif->tif_row);
            return (0);
        }

        free_entp->next = oldcodep;
        if (free_entp->next < &sp->dec_codetab[0] ||
            free_entp->next >= &sp->dec_codetab[CSIZE])
        {
            TIFFErrorExtR(tif, module,
                          "Corrupted LZW table at scanline %" PRIu32,
                          tif->tif_row);
            return (0);
        }
        free_entp->firstchar = free_entp->next->firstchar;
        free_entp->length = free_entp->next->length + 1;
        free_entp->value =
            (codep < free_entp) ? codep->firstchar : free_entp->firstchar;
        if (++free_entp > maxcodep)
        {
            if (++nbits > BITS_MAX) /* should not happen */
                nbits = BITS_MAX;
            nbitsmask = MAXCODE(nbits);
            maxcodep = sp->dec_codetab + nbitsmask;
        }
        oldcodep = codep;
        if (code >= 256)
        {
            /*
             * Code maps to a string, copy string
             * value to output (written in reverse).
             */
            if (codep->length == 0)
            {
                TIFFErrorExtR(
                    tif, module,
                    "Wrong length of decoded "
                    "string: data probably corrupted at scanline %" PRIu32,
                    tif->tif_row);
                return (0);
            }
            if (codep->length > occ)
            {
                /*
                 * String is too long for decode buffer,
                 * locate portion that will fit, copy to
                 * the decode buffer, and setup restart
                 * logic for the next decoding call.
                 */
                sp->dec_codep = codep;
                do
                {
                    codep = codep->next;
                } while (codep->length > occ);
                sp->dec_restart = occ;
                tp = op + occ;
                do
                {
                    *--tp = codep->value;
                    codep = codep->next;
                } while (--occ);
                break;
            }
            len = codep->length;
            tp = op + len;
            do
            {
                *--tp = codep->value;
                codep = codep->next;
            } while (codep && tp > op);
            assert(occ >= len);
            op += len;
            occ -= len;
        }
        else
        {
            *op++ = (uint8_t)code;
            occ--;
        }
    }

    tif->tif_rawcc -= (tmsize_t)((uint8_t *)bp - tif->tif_rawcp);
    tif->tif_rawcp = (uint8_t *)bp;

    sp->old_tif_rawcc = tif->tif_rawcc;
    sp->dec_bitsleft = dec_bitsleft;

    sp->lzw_nbits = (unsigned short)nbits;
    sp->lzw_nextdata = nextdata;
    sp->lzw_nextbits = nextbits;
    sp->dec_nbitsmask = nbitsmask;
    sp->dec_oldcodep = oldcodep;
    sp->dec_free_entp = free_entp;
    sp->dec_maxcodep = maxcodep;

    if (occ > 0)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data at scanline %" PRIu32 " (short %" PRIu64
                      " bytes)",
                      tif->tif_row, (uint64_t)occ);
        return (0);
    }
    return (1);
}